

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDDOMParser.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XSDDOMParser::docCharacters
          (XSDDOMParser *this,XMLCh *chars,XMLSize_t length,bool cdataSection)

{
  ulong uVar1;
  XMLSize_t XVar2;
  XMLBuffer *pXVar3;
  ulong uVar4;
  XMLCh *chars_00;
  XMLCh XVar5;
  bool bVar6;
  LastExtEntityInfo lastInfo;
  LastExtEntityInfo local_50;
  
  if ((this->super_XercesDOMParser).super_AbstractDOMParser.fWithinElement == true) {
    if (this->fInnerAnnotationDepth == -1) {
      bVar6 = XMLReader::isAllSpaces
                        ((((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner)->
                         fReaderMgr).fCurReader,chars,length);
      if (!bVar6) {
        ReaderMgr::getLastExtEntityInfo
                  (&((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner)->fReaderMgr,
                   &local_50);
        XSDLocator::setValues
                  (&this->fXSLocator,local_50.systemId,local_50.publicId,local_50.lineNumber,
                   local_50.colNumber);
        XSDErrorReporter::emitError
                  (&this->fXSDErrorReporter,0x49,L"http://apache.org/xml/messages/XMLValidity",
                   &(this->fXSLocator).super_Locator);
      }
    }
    else {
      if (cdataSection) {
        pXVar3 = &this->fAnnotationBuf;
        XMLBuffer::append(pXVar3,(XMLCh *)XMLUni::fgCDataStart);
        XMLBuffer::append(pXVar3,chars,length);
        XMLBuffer::append(pXVar3,L"]]>");
        return;
      }
      if (length != 0) {
        pXVar3 = &this->fAnnotationBuf;
        uVar1 = 0;
        uVar4 = 1;
        do {
          XVar5 = chars[uVar1];
          if (XVar5 == L'<') {
            if ((this->fAnnotationBuf).fIndex == (this->fAnnotationBuf).fCapacity) {
              XMLBuffer::ensureCapacity(pXVar3,1);
            }
            XVar2 = (this->fAnnotationBuf).fIndex;
            (this->fAnnotationBuf).fIndex = XVar2 + 1;
            (this->fAnnotationBuf).fBuffer[XVar2] = L'&';
            chars_00 = L"lt";
LAB_00344633:
            XMLBuffer::append(pXVar3,chars_00);
            XVar2 = (this->fAnnotationBuf).fIndex;
            XVar5 = L';';
          }
          else {
            if (XVar5 == L'&') {
              if ((this->fAnnotationBuf).fIndex == (this->fAnnotationBuf).fCapacity) {
                XMLBuffer::ensureCapacity(pXVar3,1);
              }
              XVar2 = (this->fAnnotationBuf).fIndex;
              (this->fAnnotationBuf).fIndex = XVar2 + 1;
              (this->fAnnotationBuf).fBuffer[XVar2] = L'&';
              chars_00 = L"amp";
              goto LAB_00344633;
            }
            XVar2 = (this->fAnnotationBuf).fIndex;
          }
          if (XVar2 == (this->fAnnotationBuf).fCapacity) {
            XMLBuffer::ensureCapacity(pXVar3,1);
          }
          XVar2 = pXVar3->fIndex;
          pXVar3->fIndex = XVar2 + 1;
          (this->fAnnotationBuf).fBuffer[XVar2] = XVar5;
          bVar6 = uVar4 < length;
          uVar1 = uVar4;
          uVar4 = (ulong)((int)uVar4 + 1);
        } while (bVar6);
      }
    }
  }
  return;
}

Assistant:

void XSDDOMParser::docCharacters(  const   XMLCh* const    chars
                              , const XMLSize_t       length
                              , const bool            cdataSection)
{
    // Ignore chars outside of content
    if (!fWithinElement)
        return;

    if (fInnerAnnotationDepth == -1)
    {
        if (!((ReaderMgr*) fScanner->getReaderMgr())->getCurrentReader()->isAllSpaces(chars, length))
        {
            ReaderMgr::LastExtEntityInfo lastInfo;
            fScanner->getReaderMgr()->getLastExtEntityInfo(lastInfo);
            fXSLocator.setValues(lastInfo.systemId, lastInfo.publicId, lastInfo.lineNumber, lastInfo.colNumber);
            fXSDErrorReporter.emitError(XMLValid::NonWSContent, XMLUni::fgValidityDomain, &fXSLocator);
        }
    }
    // when it's within either of the 2 annotation subelements, characters are
    // allowed and we need to store them.
    else if (cdataSection == true)
    {
        fAnnotationBuf.append(XMLUni::fgCDataStart);
        fAnnotationBuf.append(chars, length);
        fAnnotationBuf.append(XMLUni::fgCDataEnd);
    }
    else
    {
        for(unsigned int i = 0; i < length; i++ )
        {
            if(chars[i] == chAmpersand)
            {
                fAnnotationBuf.append(chAmpersand);
                fAnnotationBuf.append(XMLUni::fgAmp);
                fAnnotationBuf.append(chSemiColon);
            }
            else if (chars[i] == chOpenAngle)
            {
                fAnnotationBuf.append(chAmpersand);
                fAnnotationBuf.append(XMLUni::fgLT);
                fAnnotationBuf.append(chSemiColon);
            }
            else {
                fAnnotationBuf.append(chars[i]);
            }
        }
    }
}